

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string_view extension;
  char *in_RCX;
  FileDescriptor *file_00;
  undefined1 in_R8B;
  string_view prefix_00;
  string_view filename;
  string_view input;
  string_view input_00;
  string name;
  string prefix;
  string local_120;
  string local_100;
  string local_e0;
  undefined1 local_c0 [32];
  string local_a0;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  char *local_68;
  AlphaNum local_40;
  
  FileClassPrefix_abi_cxx11_(&local_a0,this,file);
  BaseFileName_abi_cxx11_(&local_120,this,file_00);
  filename._M_str = in_RCX;
  filename._M_len = (size_t)local_120._M_dataplus._M_p;
  StripProto_abi_cxx11_(&local_100,(compiler *)local_120._M_string_length,filename);
  input._M_str = (char *)0x1;
  input._M_len = (size_t)local_100._M_dataplus._M_p;
  (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            (&local_e0,(_anonymous_namespace_ *)local_100._M_string_length,input,(bool)in_R8B);
  local_40.piece_._M_len = local_e0._M_string_length;
  local_40.piece_._M_str = local_e0._M_dataplus._M_p;
  local_70 = 4;
  local_68 = "Root";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c0,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_80 = 10;
  pcStack_78 = "_RootClass";
  extension._M_str = "_RootClass";
  extension._M_len = 10;
  prefix_00._M_str = local_a0._M_dataplus._M_p;
  prefix_00._M_len = local_a0._M_string_length;
  input_00._M_str = (char *)local_c0._0_8_;
  input_00._M_len = local_c0._8_8_;
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,prefix_00,input_00,extension,(string *)0x0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassName(const FileDescriptor* file) {
  const std::string prefix = FileClassPrefix(file);
  const std::string name = absl::StrCat(
      UnderscoresToCamelCase(StripProto(BaseFileName(file)), true), "Root");
  // There aren't really any reserved words that end in "Root", but playing
  // it safe and checking.
  return SanitizeNameForObjC(prefix, name, "_RootClass", nullptr);
}